

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

void __thiscall ccs::anon_unknown_0::Lexer::multilineComment(Lexer *this)

{
  undefined8 uVar1;
  int iVar2;
  string *this_00;
  string local_1b0 [32];
  ostringstream _message;
  
  do {
    while( true ) {
      while( true ) {
        iVar2 = Buf::get(&this->stream_);
        if (iVar2 != 0x2a) break;
        iVar2 = Buf::peek(&this->stream_);
        if (iVar2 == 0x2f) {
          Buf::get(&this->stream_);
          return;
        }
      }
      if (iVar2 != 0x2f) break;
      iVar2 = Buf::peek(&this->stream_);
      if (iVar2 == 0x2a) {
        Buf::get(&this->stream_);
        multilineComment(this);
      }
    }
  } while (iVar2 != -1);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&_message);
  std::operator<<((ostream *)&_message,"Unterminated multi-line comment");
  this_00 = (string *)__cxa_allocate_exception(0x28);
  std::__cxx11::stringbuf::str();
  uVar1 = *(undefined8 *)&(this->stream_).line_;
  std::__cxx11::string::string(this_00,local_1b0);
  *(undefined8 *)(this_00 + 0x20) = uVar1;
  __cxa_throw(this_00,&(anonymous_namespace)::parse_error::typeinfo,parse_error::~parse_error);
}

Assistant:

void multilineComment() {
    while (true) {
      int c = stream_.get();
      if (c == EOF)
        THROW(stream_.location(), "Unterminated multi-line comment");
      if (c == '*' && stream_.peek() == '/') {
        stream_.get();
        return;
      }
      if (c == '/' && stream_.peek() == '*') {
        stream_.get();
        multilineComment();
      }
    }
  }